

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChEllipsoidShape.cpp
# Opt level: O2

void __thiscall chrono::ChEllipsoidShape::ArchiveIN(ChEllipsoidShape *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::geometry::ChEllipsoid> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChEllipsoidShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->gellipsoid;
  local_28._name = "gellipsoid";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChEllipsoidShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChEllipsoidShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gellipsoid);
}